

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O3

Value * duckdb::AggregateFunctionExtractor::IsVolatile
                  (Value *__return_storage_ptr__,AggregateFunctionCatalogEntry *entry,idx_t offset)

{
  AggregateFunction local_140;
  
  FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
            (&local_140,&(entry->functions).super_FunctionSet<duckdb::AggregateFunction>,offset);
  Value::BOOLEAN(__return_storage_ptr__,local_140.super_BaseScalarFunction.stability == VOLATILE);
  local_140.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_0196ba98;
  if (local_140.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_140.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_140.super_BaseScalarFunction);
  return __return_storage_ptr__;
}

Assistant:

static Value IsVolatile(AggregateFunctionCatalogEntry &entry, idx_t offset) {
		return Value::BOOLEAN(entry.functions.GetFunctionByOffset(offset).stability == FunctionStability::VOLATILE);
	}